

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb__hashfind(void *p)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  
  uVar1 = stb_hashptr(p);
  uVar2 = stb__alloc_mask & uVar1;
  pvVar3 = stb__allocations[(int)uVar2].p;
  if (pvVar3 != p) {
    do {
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      uVar2 = uVar2 + ((uVar1 >> 0x13) + (uVar1 >> 6) + uVar1 | 1) & stb__alloc_mask;
      pvVar3 = stb__allocations[(int)uVar2].p;
    } while (pvVar3 != p);
  }
  return uVar2;
}

Assistant:

static int stb__hashfind(void *p)
{
   stb_uint32 h = stb_hashptr(p);
   int s,n = h & stb__alloc_mask;
   if (stb__allocations[n].p == p)
      return n;
   s = stb_rehash(h)|1;
   for(;;) {
      if (stb__allocations[n].p == NULL)
         return -1;
      n = (n+s) & stb__alloc_mask;
      if (stb__allocations[n].p == p)
         return n;
   }
}